

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

void cache_tag(io_buf *cache,v_array<char> tag)

{
  size_t *psVar1;
  size_t __n;
  size_t *local_30;
  
  __n = (long)tag._end - (long)tag._begin;
  io_buf::buf_write(cache,(char **)&local_30,__n + 8);
  psVar1 = local_30;
  *local_30 = __n;
  local_30 = local_30 + 1;
  memcpy(local_30,tag._begin,__n);
  cache->head = (char *)((long)psVar1 + __n + 8);
  return;
}

Assistant:

void cache_tag(io_buf& cache, v_array<char> tag)
{
  char* c;
  cache.buf_write(c, sizeof(size_t) + tag.size());
  *(size_t*)c = tag.size();
  c += sizeof(size_t);
  memcpy(c, tag.begin(), tag.size());
  c += tag.size();
  cache.set(c);
}